

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

char * __thiscall wabt::Type::GetRefKindName(Type *this)

{
  Type *this_local;
  
  switch(this->enum_) {
  case Array:
    this_local = (Type *)anon_var_dwarf_8b4bf;
    break;
  case Struct:
    this_local = (Type *)anon_var_dwarf_8a71d;
    break;
  default:
    this_local = (Type *)anon_var_dwarf_1b78f9;
    break;
  case ExnRef:
    this_local = (Type *)0x34689c;
    break;
  case ExternRef:
    this_local = (Type *)0x346bf7;
    break;
  case FuncRef:
    this_local = (Type *)0x347384;
  }
  return (char *)this_local;
}

Assistant:

const char* GetRefKindName() const {
    switch (enum_) {
      case Type::FuncRef:   return "func";
      case Type::ExternRef: return "extern";
      case Type::ExnRef:    return "exn";
      case Type::Struct:    return "struct";
      case Type::Array:     return "array";
      default:              return "<invalid>";
    }
  }